

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiveProxy.cpp
# Opt level: O2

bool __thiscall aeron::archive::ArchiveProxy::offer(ArchiveProxy *this,int32_t length)

{
  int64_t iVar1;
  ArchiveException *pAVar2;
  char *pcVar3;
  int iVar4;
  allocator local_83;
  allocator local_82;
  allocator local_81;
  string local_80;
  string local_60;
  string local_40;
  
  iVar4 = this->retryAttempts_;
  while( true ) {
    iVar1 = ExclusivePublication::offer
                      ((this->publication_).
                       super___shared_ptr<aeron::ExclusivePublication,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,&this->buffer_,0,length + 8);
    if (0 < iVar1) break;
    if (iVar1 == -5) {
      pAVar2 = (ArchiveException *)__cxa_allocate_exception(0x48);
      std::__cxx11::string::string
                ((string *)&local_40,"offer failed due to max position being reached",&local_81);
      std::__cxx11::string::string
                ((string *)&local_60,"bool aeron::archive::ArchiveProxy::offer(std::int32_t)",
                 &local_82);
      pcVar3 = aeron::util::past_prefix
                         ("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/ArchiveProxy.cpp"
                         );
      std::__cxx11::string::string((string *)&local_80,pcVar3,&local_83);
      ArchiveException::ArchiveException(pAVar2,&local_40,&local_60,&local_80,0x114);
      __cxa_throw(pAVar2,&ArchiveException::typeinfo,
                  aeron::util::SourcedException::~SourcedException);
    }
    if (iVar1 == -1) {
      pAVar2 = (ArchiveException *)__cxa_allocate_exception(0x48);
      std::__cxx11::string::string
                ((string *)&local_40,"connection to the archive is no longer available",&local_81);
      std::__cxx11::string::string
                ((string *)&local_60,"bool aeron::archive::ArchiveProxy::offer(std::int32_t)",
                 &local_82);
      pcVar3 = aeron::util::past_prefix
                         ("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/ArchiveProxy.cpp"
                         );
      std::__cxx11::string::string((string *)&local_80,pcVar3,&local_83);
      ArchiveException::ArchiveException(pAVar2,&local_40,&local_60,&local_80,0x112);
      __cxa_throw(pAVar2,&ArchiveException::typeinfo,
                  aeron::util::SourcedException::~SourcedException);
    }
    if (iVar1 == -4) {
      pAVar2 = (ArchiveException *)__cxa_allocate_exception(0x48);
      std::__cxx11::string::string
                ((string *)&local_40,"connection to the archive has been closed",&local_81);
      std::__cxx11::string::string
                ((string *)&local_60,"bool aeron::archive::ArchiveProxy::offer(std::int32_t)",
                 &local_82);
      pcVar3 = aeron::util::past_prefix
                         ("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/ArchiveProxy.cpp"
                         );
      std::__cxx11::string::string((string *)&local_80,pcVar3,&local_83);
      ArchiveException::ArchiveException(pAVar2,&local_40,&local_60,&local_80,0x110);
      __cxa_throw(pAVar2,&ArchiveException::typeinfo,
                  aeron::util::SourcedException::~SourcedException);
    }
    if (iVar4 < 2) break;
    iVar4 = iVar4 + -1;
    sched_yield();
  }
  return 0 < iVar1;
}

Assistant:

bool ArchiveProxy::offer(std::int32_t length) {
    std::int32_t attempts = retryAttempts_;
    while (true) {
        std::int64_t result = publication_->offer(buffer_, 0, codecs::MessageHeader::encodedLength() + length);
        if (result > 0) {
            return true;
        }

        if (result == aeron::PUBLICATION_CLOSED) {
            throw ArchiveException("connection to the archive has been closed", SOURCEINFO);
        } else if (result == aeron::NOT_CONNECTED) {
            throw ArchiveException("connection to the archive is no longer available", SOURCEINFO);
        } else if (result == aeron::MAX_POSITION_EXCEEDED) {
            throw ArchiveException("offer failed due to max position being reached", SOURCEINFO);
        }

        if (--attempts <= 0) {
            return false;
        }

        idle_.idle();
    }
}